

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsItem::mapRectFromParent(QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItemPrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar2;
  QRectF *p;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RSI->extras);
  if (pQVar1->transformData == (TransformData *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->extras);
    QVar2 = ::operator-((QPointF *)p);
    QRectF::translated((QRectF *)QVar2.yp,(QPointF *)QVar2.xp);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RSI->extras);
    QGraphicsItemPrivate::transformToParent(in_RSI);
    QTransform::inverted(local_58);
    QTransform::mapRect((QRectF *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return p;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItem::mapRectFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().mapRect(rect);
}